

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O1

void __thiscall
delta_complex_cell_t::compute_boundary
          (delta_complex_cell_t *this,delta_complex_t *complex,size_t thread,
          vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
          *new_cell_cofaces)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  vector<long,_std::allocator<long>_> *__first1;
  vector<long,_std::allocator<long>_> *__last1;
  iterator iVar5;
  pointer plVar6;
  iterator __position;
  bool bVar7;
  bool bVar8;
  pointer plVar9;
  ulong uVar10;
  index_t iVar11;
  long lVar12;
  long *__args;
  vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *this_00;
  ulong uVar13;
  vector<long,_std::allocator<long>_> temp;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  tempOrient;
  ulong local_130;
  vector<long,_std::allocator<long>_> local_128;
  vector<long,_std::allocator<long>_> local_108;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_e8;
  ulong local_c8;
  vector<long,std::allocator<long>> *local_c0;
  long local_b8;
  vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
  *local_b0;
  vector<long,_std::allocator<long>_> local_a8;
  vector<long,_std::allocator<long>_> local_90;
  vector<long,_std::allocator<long>_> local_78;
  vector<long,_std::allocator<long>_> local_60;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_48;
  
  if ((this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_c0 = (vector<long,std::allocator<long>> *)&this->boundary;
    local_b8 = thread * 0x18;
    local_130 = 0;
    local_b0 = new_cell_cofaces;
    do {
      local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (long *)0x0;
      local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (long *)0x0;
      local_e8.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish != plVar9) {
        local_c8 = 1;
        if (1 < (uint)local_130) {
          local_c8 = local_130 & 0xffffffff;
        }
        uVar13 = 0;
        do {
          if (uVar13 != local_130) {
            if (local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)&local_128,
                         (iterator)
                         local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish,plVar9 + uVar13);
            }
            else {
              *local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish = plVar9[uVar13];
              local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (uVar13 == 0 || local_130 <= uVar13) {
              if (local_c8 < uVar13) {
                local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
                ::emplace_back<std::vector<long,std::allocator<long>>>
                          ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
                            *)&local_e8,&local_108);
                if (local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_108.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_108.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                pvVar1 = (this->orientation).
                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                plVar9 = pvVar1[uVar13 - 1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (*(pointer *)
                     ((long)&pvVar1[uVar13 - 1].super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data + 8) != plVar9) {
                  lVar12 = 0;
                  uVar10 = 0;
                  do {
                    if (local_130 != uVar10) {
                      iVar5._M_current =
                           local_e8.
                           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar5._M_current ==
                          local_e8.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                                  ((vector<long,std::allocator<long>> *)
                                   (local_e8.
                                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1),iVar5,
                                   (long *)((long)plVar9 + lVar12));
                      }
                      else {
                        *iVar5._M_current = *(long *)((long)plVar9 + lVar12);
                        local_e8.
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                      }
                    }
                    uVar10 = uVar10 + 1;
                    pvVar1 = (this->orientation).
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    plVar9 = pvVar1[uVar13 - 1].super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    lVar12 = lVar12 + 8;
                  } while (uVar10 < (ulong)((long)*(pointer *)
                                                   ((long)&pvVar1[uVar13 - 1].
                                                                                                                      
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data + 8) -
                                            (long)plVar9 >> 3));
                }
              }
            }
            else {
              std::
              vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ::push_back(&local_e8,
                          (this->orientation).
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (uVar13 - 1));
            }
          }
          uVar13 = uVar13 + 1;
          plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar13 < (ulong)((long)(this->vertices).
                                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)plVar9 >> 3));
      }
      uVar13 = 0;
      bVar7 = false;
      while( true ) {
        if (bVar7) {
          bVar8 = false;
        }
        else {
          plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          plVar6 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar3 = (complex->cliques).
                   super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::vector<long,_std::allocator<long>_>::vector(&local_78,&local_128);
          iVar11 = delta_complex_t::get_clique(complex,&local_78);
          lVar12 = *(long *)&pvVar3[((ulong)((long)plVar9 - (long)plVar6) >> 3) - 2].
                             super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                             super__Vector_impl_data;
          bVar8 = uVar13 < (ulong)(*(long *)(lVar12 + 8 + iVar11 * 0x70) -
                                   *(long *)(lVar12 + iVar11 * 0x70) >> 3);
          if (local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        if (!bVar8) break;
        uVar10 = (ulong)((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3;
        pvVar2 = (complex->cells).
                 super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 = (complex->cliques).
                 super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<long,_std::allocator<long>_>::vector(&local_90,&local_128);
        iVar11 = delta_complex_t::get_clique(complex,&local_90);
        lVar12 = *(long *)(*(long *)(*(long *)&pvVar3[uVar10 - 2].
                                               super__Vector_base<clique_t,_std::allocator<clique_t>_>
                                               ._M_impl + iVar11 * 0x70) + uVar13 * 8);
        lVar4 = *(long *)&pvVar2[uVar10 - 2].
                          super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
        ;
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::vector(&local_48,&local_e8);
        lVar12 = lVar12 * 0xe8;
        __first1 = *(vector<long,_std::allocator<long>_> **)(lVar4 + 0x48 + lVar12);
        __last1 = *(vector<long,_std::allocator<long>_> **)(lVar4 + 0x50 + lVar12);
        if ((long)__last1 - (long)__first1 ==
            (long)local_48.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          bVar8 = std::__equal<false>::
                  equal<std::vector<long,std::allocator<long>>const*,std::vector<long,std::allocator<long>>const*>
                            (__first1,__last1,
                             local_48.
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
          bVar8 = false;
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector(&local_48);
        if (local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (bVar8 != false) {
          uVar10 = (ulong)((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3;
          pvVar2 = (complex->cells).
                   super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar3 = (complex->cliques).
                   super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::vector<long,_std::allocator<long>_>::vector(&local_a8,&local_128);
          iVar11 = delta_complex_t::get_clique(complex,&local_a8);
          __args = (long *)(*(long *)&pvVar2[uVar10 - 2].
                                      super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                            + *(long *)(*(long *)(*(long *)&pvVar3[uVar10 - 2].
                                                                                                                        
                                                  super__Vector_base<clique_t,_std::allocator<clique_t>_>
                                                  ._M_impl + iVar11 * 0x70) + uVar13 * 8) * 0xe8 +
                           0x60);
          iVar5._M_current =
               (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      (local_c0,iVar5,__args);
          }
          else {
            *iVar5._M_current = *__args;
            (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          this_00 = (vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
                    ((long)&(((local_b0->
                              super__Vector_base<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                            )._M_impl.super__Vector_impl_data + local_b8);
          plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          plVar6 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar3 = (complex->cliques).
                   super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::vector<long,_std::allocator<long>_>::vector(&local_60,&local_128);
          iVar11 = delta_complex_t::get_clique(complex,&local_60);
          local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)
                      (*(long *)(*(long *)&pvVar3[((ulong)((long)plVar9 - (long)plVar6) >> 3) - 2].
                                           super__Vector_base<clique_t,_std::allocator<clique_t>_>.
                                           _M_impl.super__Vector_impl_data + iVar11 * 0x70) +
                      uVar13 * 8);
          local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)this->location;
          __position._M_current = *(pair<long,_long> **)(this_00 + 8);
          if (__position._M_current == *(pair<long,_long> **)(this_00 + 0x10)) {
            std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
            _M_realloc_insert<std::pair<long,long>>
                      (this_00,__position,(pair<long,_long> *)&local_108);
          }
          else {
            (__position._M_current)->first =
                 (long)local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start;
            (__position._M_current)->second =
                 (long)local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
          }
          if (local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          bVar7 = true;
        }
        uVar13 = uVar13 + 1;
      }
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector(&local_e8);
      if (local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_130 = local_130 + 1;
    } while (local_130 <
             (ulong)((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void delta_complex_cell_t::compute_boundary(delta_complex_t* complex, size_t thread, std::vector<std::vector<std::pair<index_t, index_t>>>& new_cell_cofaces){
	//For each vertex delete it from the face, by removing it from the vertex set and
	//the relevant rows and columns of the orientation matrix
	//find this face in the complex and add its index to the boundary of the cell,
	//also add this cell to the coboundary of the found cell
	for(int i = 0; i < vertices.size(); i++){
		std::vector<index_t> temp;
		std::vector<std::vector<index_t>> tempOrient;
		for(int j = 0; j < vertices.size(); j++){
			if(j != i){
				temp.push_back(vertices[j]);
				if(j < i && j > 0){ tempOrient.push_back(orientation[j-1]);
				} else if(j > i && j > 1){
					tempOrient.push_back(std::vector<index_t>());
					for(int k = 0; k < orientation[j-1].size(); k++){
						if(k != i){
							tempOrient.back().push_back(orientation[j-1][k]);
						}
					}
				}
			}
		}
        bool found = false;
        int f = 0;
        while(!found && f < complex->cliques[dimension()-1][complex->get_clique(temp)].faces.size()){
			if(complex->cells[dimension()-1][complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f]].same_orientation(tempOrient)){
				boundary.push_back(complex->cells[dimension()-1][complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f]].location);
                new_cell_cofaces[thread].push_back(std::make_pair(complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f],location));
				found = true;
			}
            f++;
		}
	}
}